

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O3

void __thiscall
TPZDohrAssembly<std::complex<double>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<double>_> *this,int isub,
          TPZFMatrix<std::complex<double>_> *global,TPZFMatrix<std::complex<double>_> *local)

{
  TPZVec<int> *pTVar1;
  ulong uVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  pTVar1 = (this->fCoarseEqs).fStore;
  uVar2 = pTVar1[isub].fNElements;
  uVar3 = (global->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  iVar5 = (int)uVar2;
  iVar7 = (int)uVar3;
  (*(local->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local,(long)iVar5,(long)iVar7);
  if (0 < iVar7) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      if (0 < iVar5) {
        lVar11 = 2;
        uVar9 = 0;
        do {
          (*(global->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(global,(long)pTVar1[isub].fStore[uVar9],uVar8);
          lVar6 = (local->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar6 <= (long)uVar9) ||
             ((local->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
              (long)uVar8)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = lVar6 * lVar10;
          pcVar4 = local->fElem;
          *(undefined8 *)(pcVar4->_M_value + lVar11 * 4 + lVar6 + -8) = extraout_XMM0_Qa;
          *(undefined8 *)(pcVar4->_M_value + lVar11 * 4 + lVar6) = in_XMM1_Qa;
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 4;
        } while ((uVar2 & 0x7fffffff) != uVar9);
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar8 != (uVar3 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}